

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall MT32Emu::Synth::initPCMList(Synth *this,Bit16u mapAddress,Bit16u count)

{
  Bit32u BVar1;
  uint uVar2;
  ulong uVar3;
  Bit32u rLen;
  Bit32u rLenExp;
  Bit32u rAddr;
  int i;
  ControlROMPCMStruct *tps;
  Bit16u count_local;
  Bit16u mapAddress_local;
  Synth *this_local;
  
  uVar3 = (ulong)mapAddress;
  rLenExp = 0;
  while( true ) {
    if ((int)(uint)count <= (int)rLenExp) {
      return false;
    }
    BVar1 = (uint)this->controlROMData[(long)(int)rLenExp * 4 + uVar3 + 0x60 + -0x60] * 0x800;
    uVar2 = 0x800 << (sbyte)((int)(this->controlROMData[(long)(int)rLenExp * 4 + uVar3 + 1] & 0x70)
                            >> 4);
    if (this->pcmROMSize < (ulong)(BVar1 + uVar2)) break;
    this->pcmWaves[(int)rLenExp].addr = BVar1;
    this->pcmWaves[(int)rLenExp].len = uVar2;
    this->pcmWaves[(int)rLenExp].loop =
         (this->controlROMData[(long)(int)rLenExp * 4 + uVar3 + 1] & 0x80) != 0;
    this->pcmWaves[(int)rLenExp].controlROMPCMStruct =
         (ControlROMPCMStruct *)
         (this->controlROMData + (long)(int)rLenExp * 4 + uVar3 + 0x60 + -0x60);
    rLenExp = rLenExp + 1;
  }
  printDebug(this,
             "Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X"
             ,(ulong)rLenExp,
             (ulong)this->controlROMData[(long)(int)rLenExp * 4 + uVar3 + 0x60 + -0x60] << 0xb,
             (ulong)uVar2);
  return false;
}

Assistant:

bool Synth::initPCMList(Bit16u mapAddress, Bit16u count) {
	ControlROMPCMStruct *tps = reinterpret_cast<ControlROMPCMStruct *>(&controlROMData[mapAddress]);
	for (int i = 0; i < count; i++) {
		Bit32u rAddr = tps[i].pos * 0x800;
		Bit32u rLenExp = (tps[i].len & 0x70) >> 4;
		Bit32u rLen = 0x800 << rLenExp;
		if (rAddr + rLen > pcmROMSize) {
			printDebug("Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X", i, rAddr, rLen);
			return false;
		}
		pcmWaves[i].addr = rAddr;
		pcmWaves[i].len = rLen;
		pcmWaves[i].loop = (tps[i].len & 0x80) != 0;
		pcmWaves[i].controlROMPCMStruct = &tps[i];
		//int pitch = (tps[i].pitchMSB << 8) | tps[i].pitchLSB;
		//bool unaffectedByMasterTune = (tps[i].len & 0x01) == 0;
		//printDebug("PCM %d: pos=%d, len=%d, pitch=%d, loop=%s, unaffectedByMasterTune=%s", i, rAddr, rLen, pitch, pcmWaves[i].loop ? "YES" : "NO", unaffectedByMasterTune ? "YES" : "NO");
	}
	return false;
}